

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O2

void __thiscall Cgmres<Model>::F_func(Cgmres<Model> *this,double *ret,double *U,double *x,double t)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  short sVar4;
  double *ret_00;
  double *pdVar5;
  double c;
  double ltau [102];
  double xtau [102];
  
  if (ret != U) {
    c = get_dtau(this,t);
    ret_00 = xtau;
    mov(ret_00,x,2);
    pdVar5 = xtau;
    for (lVar2 = 0; pdVar5 = pdVar5 + 2, lVar2 != 0x4b0; lVar2 = lVar2 + 0x18) {
      *pdVar5 = pdVar5[-1];
      pdVar5[1] = -pdVar5[-2] - pdVar5[-1] * *(double *)((long)U + lVar2);
      mul(pdVar5,pdVar5,c,2);
      add(pdVar5,pdVar5,pdVar5 + -2,2);
    }
    ltau[100] = xtau[100];
    ltau[0x65] = xtau[0x65] * 10.0;
    uVar3 = 0x93;
    uVar1 = 0x62;
    for (sVar4 = 0x31; -1 < sVar4; sVar4 = sVar4 + -1) {
      pdVar5 = ltau + uVar1;
      Model::dHdx(pdVar5,xtau + uVar1,U + (uVar3 & 0xffff),this->ptau,ltau + (ulong)uVar1 + 2);
      mul(pdVar5,pdVar5,c,2);
      add(pdVar5,pdVar5,ltau + (ulong)uVar1 + 2,2);
      uVar3 = (ulong)((int)uVar3 - 3);
      uVar1 = uVar1 - 2;
    }
    pdVar5 = ltau;
    for (lVar2 = 0; pdVar5 = pdVar5 + 2, lVar2 != 0x4b0; lVar2 = lVar2 + 0x18) {
      Model::dHdu((double *)((long)ret + lVar2),ret_00,(double *)((long)U + lVar2),this->ptau,pdVar5
                 );
      ret_00 = ret_00 + 2;
    }
    return;
  }
  printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n","F_func");
  exit(-1);
}

Assistant:

void F_func(double* ret, const double* U, const double* x, const double t) const {
    uint16_t idx_x, idx_u, idx_p;
    double dtau;
    double xtau[dim_x * (dv + 1)];
    double ltau[dim_x * (dv + 1)];

#ifdef DEBUG_MODE
    if (ret == U) {
      printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n", __func__);
      exit(-1);
    }
#endif

    // Prediction horizon
    dtau = get_dtau(t);

    // State equation
    // x(0) = x
    // x(i + 1) = x(i) + dxdt(x(i), u(i), p(i)) * dtau
    mov(&xtau[0], x, dim_x);
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dxdt(&xtau[idx_x + dim_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p]);
      mul(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], dtau, dim_x);
      add(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], &xtau[idx_x], dim_x);
    }

    // Adjoint equation
    // lmd(N) = dPhidx(x(N), p(N))
    // lmd(i) = lmd(i + 1) + dHdx(x(i), u(i), p(i), lmd(i + 1)) * dtau
    Model::dPhidx(&ltau[dim_x * dv], &xtau[dim_x * dv], &ptau[dim_p * dv]);
    for (int16_t i = dv - 1; i >= 0; i--) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdx(&ltau[idx_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
      mul(&ltau[idx_x], &ltau[idx_x], dtau, dim_x);
      add(&ltau[idx_x], &ltau[idx_x], &ltau[idx_x + dim_x], dim_x);
    }

    // F(i) = dHdU(x(i), u(i), lmd(i + 1))
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdu(&ret[idx_u], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
    }
  }